

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

bool __thiscall tf::Executor::_invoke_async_task(Executor *this,Worker *worker,Node *node)

{
  char cVar1;
  bool bVar2;
  function<void_(tf::Runtime_&)> *this_00;
  function<void_(tf::Runtime_&)> *work;
  
  work = (function<void_(tf::Runtime_&)> *)0x0;
  if (*(__index_type *)
       ((long)&(node->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) == '\a') {
    work = (function<void_(tf::Runtime_&)> *)&node->_handle;
  }
  cVar1 = work[1].super__Function_base._M_functor._M_pod_data[0];
  if (cVar1 == '\x02') {
    bVar2 = _invoke_runtime_task_impl(this,worker,node,(function<void_(tf::Runtime_&,_bool)> *)work)
    ;
  }
  else {
    if (cVar1 != '\x01') {
      if (cVar1 != '\0') {
        return false;
      }
      _observer_prologue(this,worker,node);
      this_00 = (function<void_(tf::Runtime_&)> *)0x0;
      if (work[1].super__Function_base._M_functor._M_pod_data[0] == '\0') {
        this_00 = work;
      }
      std::function<void_()>::operator()((function<void_()> *)this_00);
      _observer_epilogue(this,worker,node);
      return false;
    }
    bVar2 = _invoke_runtime_task_impl(this,worker,node,work);
  }
  if (bVar2 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool Executor::_invoke_async_task(Worker& worker, Node* node) {
  auto& work = std::get_if<Node::Async>(&node->_handle)->work;
  switch(work.index()) {
    // void()
    case 0:
      _observer_prologue(worker, node);
      TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
        std::get_if<0>(&work)->operator()();
      });
      _observer_epilogue(worker, node);
    break;
    
    // void(Runtime&)
    case 1:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<1>(&work))) {
        return true;
      }
    break;
    
    // void(Runtime&, bool)
    case 2:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<2>(&work))) {
        return true;
      }
    break;
  }

  return false;
}